

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kinsol.c
# Opt level: O1

int AndersonAcc(KINMem kin_mem,N_Vector gval,N_Vector fv,N_Vector x,N_Vector xold,int iter,
               realtype *R,realtype *gamma)

{
  ulong uVar1;
  double dVar2;
  int *piVar3;
  realtype *c;
  N_Vector *X;
  N_Vector y;
  uint uVar4;
  int extraout_EAX;
  int iVar5;
  long lVar6;
  long lVar7;
  long lVar8;
  int nvec;
  long lVar9;
  long lVar10;
  realtype *prVar11;
  long lVar12;
  ulong uVar13;
  long lVar14;
  ulong uVar15;
  realtype *prVar16;
  ulong uVar17;
  long lVar18;
  double *pdVar19;
  double dVar20;
  realtype rVar21;
  double dVar22;
  double dVar23;
  realtype *local_40;
  
  piVar3 = kin_mem->kin_ipt_map;
  c = kin_mem->kin_cv;
  X = kin_mem->kin_Xv;
  uVar4 = iter - 1;
  lVar6 = (long)(int)uVar4;
  lVar8 = lVar6 % kin_mem->kin_m_aa;
  N_VLinearSum(1.0,gval,-1.0,xold,fv);
  if (0 < iter) {
    N_VLinearSum(1.0,gval,-1.0,kin_mem->kin_gold_aa,kin_mem->kin_dg_aa[lVar8]);
    N_VLinearSum(1.0,fv,-1.0,kin_mem->kin_fold_aa,kin_mem->kin_df_aa[lVar8]);
  }
  N_VScale(1.0,gval,kin_mem->kin_gold_aa);
  N_VScale(1.0,fv,kin_mem->kin_fold_aa);
  if (iter == 1) {
    rVar21 = N_VDotProd(kin_mem->kin_df_aa[lVar8],kin_mem->kin_df_aa[lVar8]);
    if (rVar21 < 0.0) {
      dVar23 = sqrt(rVar21);
    }
    else {
      dVar23 = SQRT(rVar21);
    }
    *R = dVar23;
    N_VScale(1.0 / dVar23,kin_mem->kin_df_aa[lVar8],kin_mem->kin_q_aa[lVar8]);
    *piVar3 = 0;
  }
  else {
    if (iter == 0) {
      N_VScale(1.0,gval,x);
      return extraout_EAX;
    }
    if (kin_mem->kin_m_aa < (long)iter) {
      lVar6 = kin_mem->kin_m_aa;
      if (lVar6 < 2) {
        lVar14 = lVar6 + -1;
      }
      else {
        local_40 = R + 1;
        lVar10 = 2;
        lVar18 = 0x10;
        lVar12 = 0;
        do {
          lVar9 = lVar12 + 1;
          dVar23 = R[lVar6 * lVar9 + lVar12];
          dVar22 = R[lVar6 * lVar9 + lVar12 + 1];
          dVar20 = dVar23 * dVar23 + dVar22 * dVar22;
          if (dVar20 < 0.0) {
            dVar20 = sqrt(dVar20);
          }
          else {
            dVar20 = SQRT(dVar20);
          }
          dVar23 = dVar23 / dVar20;
          dVar22 = dVar22 / dVar20;
          lVar6 = kin_mem->kin_m_aa;
          R[lVar6 * lVar9 + lVar12] = dVar20;
          R[lVar6 * lVar9 + lVar12 + 1] = 0.0;
          if ((lVar12 < lVar6 + -1) && (lVar12 + 2 < lVar6)) {
            lVar7 = lVar6 * lVar18;
            prVar11 = local_40;
            lVar14 = lVar10;
            do {
              dVar20 = *(double *)((long)prVar11 + lVar7 + -8);
              dVar2 = *(double *)((long)prVar11 + lVar7);
              *(double *)((long)prVar11 + lVar7) = dVar20 * -dVar22 + dVar2 * dVar23;
              *(double *)((long)prVar11 + lVar7 + -8) = dVar23 * dVar20 + dVar22 * dVar2;
              lVar14 = lVar14 + 1;
              prVar11 = prVar11 + lVar6;
            } while (lVar14 < lVar6);
          }
          N_VLinearSum(dVar23,kin_mem->kin_q_aa[lVar12],dVar22,kin_mem->kin_q_aa[lVar9],
                       kin_mem->kin_vtemp2);
          y = kin_mem->kin_q_aa[lVar9];
          N_VLinearSum(-dVar22,kin_mem->kin_q_aa[lVar12],dVar23,y,y);
          N_VScale(1.0,kin_mem->kin_vtemp2,kin_mem->kin_q_aa[lVar12]);
          lVar6 = kin_mem->kin_m_aa;
          lVar14 = lVar6 + -1;
          lVar10 = lVar10 + 1;
          lVar18 = lVar18 + 8;
          local_40 = local_40 + 1;
          lVar12 = lVar9;
        } while (lVar9 < lVar14);
      }
      if (1 < lVar6) {
        lVar12 = 1;
        prVar11 = R;
        do {
          lVar10 = lVar14;
          prVar16 = prVar11;
          if (0 < lVar14) {
            do {
              *prVar16 = prVar16[lVar6];
              lVar10 = lVar10 + -1;
              prVar16 = prVar16 + 1;
            } while (lVar10 != 0);
          }
          lVar12 = lVar12 + 1;
          prVar11 = prVar11 + lVar6;
        } while (lVar12 != lVar6);
      }
      N_VScale(1.0,kin_mem->kin_df_aa[lVar8],kin_mem->kin_vtemp2);
      if (1 < kin_mem->kin_m_aa) {
        lVar6 = 0;
        do {
          rVar21 = N_VDotProd(kin_mem->kin_q_aa[lVar6],kin_mem->kin_vtemp2);
          R[(kin_mem->kin_m_aa + -1) * kin_mem->kin_m_aa + lVar6] = rVar21;
          N_VLinearSum(1.0,kin_mem->kin_vtemp2,-rVar21,kin_mem->kin_q_aa[lVar6],kin_mem->kin_vtemp2)
          ;
          lVar6 = lVar6 + 1;
        } while (lVar6 < kin_mem->kin_m_aa + -1);
      }
      rVar21 = N_VDotProd(kin_mem->kin_vtemp2,kin_mem->kin_vtemp2);
      if (rVar21 < 0.0) {
        dVar23 = sqrt(rVar21);
      }
      else {
        dVar23 = SQRT(rVar21);
      }
      lVar6 = kin_mem->kin_m_aa;
      R[lVar6 * lVar6 + -1] = dVar23;
      N_VScale(1.0 / dVar23,kin_mem->kin_vtemp2,kin_mem->kin_q_aa[lVar6 + -1]);
      lVar6 = kin_mem->kin_m_aa;
      iVar5 = (int)lVar8;
      if (iVar5 + 1 < lVar6) {
        uVar13 = 0;
        do {
          piVar3[uVar13] = iVar5 + 1 + (int)uVar13;
          lVar14 = (long)(iVar5 + 1) + uVar13;
          uVar13 = uVar13 + 1;
        } while (lVar14 + 1 < lVar6);
        uVar13 = uVar13 & 0xffffffff;
      }
      else {
        uVar13 = 0;
      }
      if (-1 < lVar8) {
        lVar6 = 0;
        do {
          piVar3[uVar13 + lVar6] = (int)lVar6;
          lVar6 = lVar6 + 1;
        } while (iVar5 + 1 != (int)lVar6);
      }
    }
    else {
      N_VScale(1.0,kin_mem->kin_df_aa[lVar8],kin_mem->kin_vtemp2);
      if (1 < iter) {
        uVar13 = 0;
        do {
          piVar3[uVar13] = (int)uVar13;
          rVar21 = N_VDotProd(kin_mem->kin_q_aa[uVar13],kin_mem->kin_vtemp2);
          *(realtype *)((long)R + uVar13 * 8 + kin_mem->kin_m_aa * lVar6 * 8) = rVar21;
          N_VLinearSum(1.0,kin_mem->kin_vtemp2,-rVar21,kin_mem->kin_q_aa[uVar13],kin_mem->kin_vtemp2
                      );
          uVar13 = uVar13 + 1;
        } while (uVar4 != uVar13);
      }
      rVar21 = N_VDotProd(kin_mem->kin_vtemp2,kin_mem->kin_vtemp2);
      if (rVar21 < 0.0) {
        dVar23 = sqrt(rVar21);
      }
      else {
        dVar23 = SQRT(rVar21);
      }
      R[kin_mem->kin_m_aa * lVar6 + (long)iter + -1] = dVar23;
      N_VScale(1.0 / dVar23,kin_mem->kin_vtemp2,kin_mem->kin_q_aa[lVar8]);
      piVar3[lVar6] = uVar4;
    }
  }
  uVar13 = kin_mem->kin_m_aa & 0xffffffff;
  if ((long)iter <= kin_mem->kin_m_aa) {
    uVar13 = (ulong)(uint)iter;
  }
  nvec = (int)uVar13;
  iVar5 = N_VDotProdMulti(nvec,fv,kin_mem->kin_q_aa,gamma);
  if (iVar5 == 0) {
    *c = 1.0;
    *X = gval;
    if (nvec < 1) {
      uVar15 = 1;
    }
    else {
      lVar8 = kin_mem->kin_m_aa;
      lVar6 = uVar13 * 8;
      prVar16 = gamma + uVar13;
      prVar11 = R + uVar13;
      uVar15 = 1;
      uVar17 = uVar13;
      do {
        prVar11 = prVar11 + -1;
        uVar1 = uVar17 - 1;
        if ((long)uVar17 < (long)uVar13) {
          lVar14 = kin_mem->kin_m_aa;
          dVar23 = gamma[uVar1];
          pdVar19 = (double *)(lVar14 * lVar6 + (long)prVar11);
          lVar12 = 0;
          do {
            dVar23 = dVar23 - *pdVar19 * prVar16[lVar12];
            gamma[uVar1] = dVar23;
            lVar12 = lVar12 + 1;
            pdVar19 = pdVar19 + lVar14;
          } while ((int)uVar17 + (int)lVar12 < nvec);
        }
        dVar23 = gamma[uVar1];
        dVar22 = R[(lVar8 + 1) * uVar1];
        gamma[uVar1] = dVar23 / dVar22;
        c[uVar15] = -(dVar23 / dVar22);
        X[uVar15] = kin_mem->kin_dg_aa[piVar3[uVar1]];
        uVar15 = uVar15 + 1;
        prVar16 = prVar16 + -1;
        lVar6 = lVar6 + -8;
        uVar17 = uVar1;
      } while (uVar15 != nvec + 1);
    }
    iVar5 = N_VLinearCombination((int)uVar15,c,X,x);
    return iVar5;
  }
  return iVar5;
}

Assistant:

static int AndersonAcc(KINMem kin_mem, N_Vector gval, N_Vector fv, 
		       N_Vector x, N_Vector xold, 
		       int iter, realtype *R, realtype *gamma)
{
  int i_pt, i, j, lAA, retval;
  int *ipt_map;
  realtype alfa;
  realtype a, b, temp, c, s;

  /* local shortcuts for fused vector operation */
  int       nvec=0;
  realtype* cv=kin_mem->kin_cv;
  N_Vector* Xv=kin_mem->kin_Xv;

  ipt_map = kin_mem->kin_ipt_map;
  i_pt = iter-1 - ((iter-1)/kin_mem->kin_m_aa)*kin_mem->kin_m_aa;
  N_VLinearSum(ONE, gval, -1.0, xold, fv);
  if (iter > 0) {
    /* compute dg_new = gval -gval_old*/
    N_VLinearSum(ONE, gval, -1.0, kin_mem->kin_gold_aa, kin_mem->kin_dg_aa[i_pt]);
    /* compute df_new = fval - fval_old */
    N_VLinearSum(ONE, fv, -1.0, kin_mem->kin_fold_aa, kin_mem->kin_df_aa[i_pt]);
  }

  N_VScale(ONE, gval, kin_mem->kin_gold_aa);
  N_VScale(ONE, fv, kin_mem->kin_fold_aa);

  if (iter == 0) {
    N_VScale(ONE, gval, x);
  }
  else {
    if (iter == 1) {
      R[0] = sqrt(N_VDotProd(kin_mem->kin_df_aa[i_pt], kin_mem->kin_df_aa[i_pt]));
      alfa = 1/R[0];
      N_VScale(alfa, kin_mem->kin_df_aa[i_pt], kin_mem->kin_q_aa[i_pt]);
      ipt_map[0] = 0;
    }
    else if (iter <= kin_mem->kin_m_aa) {
      N_VScale(ONE, kin_mem->kin_df_aa[i_pt], kin_mem->kin_vtemp2);
      for (j=0; j < (iter-1); j++) {
        ipt_map[j] = j;
        R[(iter-1)*kin_mem->kin_m_aa+j] = N_VDotProd(kin_mem->kin_q_aa[j], kin_mem->kin_vtemp2);
        N_VLinearSum(ONE,kin_mem->kin_vtemp2, -R[(iter-1)*kin_mem->kin_m_aa+j], kin_mem->kin_q_aa[j], kin_mem->kin_vtemp2);
      }
      R[(iter-1)*kin_mem->kin_m_aa+iter-1] = sqrt(N_VDotProd(kin_mem->kin_vtemp2, kin_mem->kin_vtemp2));
      N_VScale((1/R[(iter-1)*kin_mem->kin_m_aa+iter-1]), kin_mem->kin_vtemp2, kin_mem->kin_q_aa[i_pt]);
      ipt_map[iter-1] = iter-1;
    }
    else {
      /* Delete left-most column vector from QR factorization */
      for (i=0; i < kin_mem->kin_m_aa-1; i++) {
        a = R[(i+1)*kin_mem->kin_m_aa + i];
        b = R[(i+1)*kin_mem->kin_m_aa + i+1];
        temp = sqrt(a*a + b*b);
        c = a / temp;
        s = b / temp;
        R[(i+1)*kin_mem->kin_m_aa + i] = temp;
        R[(i+1)*kin_mem->kin_m_aa + i+1] = 0.0;
	/* OK to re-use temp */
        if (i < kin_mem->kin_m_aa-1) {
          for (j = i+2; j < kin_mem->kin_m_aa; j++) {
            a = R[j*kin_mem->kin_m_aa + i];
            b = R[j*kin_mem->kin_m_aa + i+1];
            temp = c * a + s * b;
            R[j*kin_mem->kin_m_aa + i+1] = -s*a + c*b;
            R[j*kin_mem->kin_m_aa + i] = temp;
	  }
	}
        N_VLinearSum(c, kin_mem->kin_q_aa[i], s, kin_mem->kin_q_aa[i+1], kin_mem->kin_vtemp2);
        N_VLinearSum(-s, kin_mem->kin_q_aa[i], c, kin_mem->kin_q_aa[i+1], kin_mem->kin_q_aa[i+1]);
        N_VScale(ONE, kin_mem->kin_vtemp2, kin_mem->kin_q_aa[i]);
      }

      /* Shift R to the left by one. */
      for (i = 1; i < kin_mem->kin_m_aa; i++) {
        for (j = 0; j < kin_mem->kin_m_aa-1; j++) {
          R[(i-1)*kin_mem->kin_m_aa + j] = R[i*kin_mem->kin_m_aa + j];
        }
      }

      /* Add the new df vector */
      N_VScale(ONE, kin_mem->kin_df_aa[i_pt], kin_mem->kin_vtemp2);
      for (j=0; j < (kin_mem->kin_m_aa-1); j++) {
        R[(kin_mem->kin_m_aa-1)*kin_mem->kin_m_aa+j] = N_VDotProd(kin_mem->kin_q_aa[j], kin_mem->kin_vtemp2);
        N_VLinearSum(ONE, kin_mem->kin_vtemp2, -R[(kin_mem->kin_m_aa-1)*kin_mem->kin_m_aa+j], kin_mem->kin_q_aa[j],kin_mem->kin_vtemp2);
      }
      R[(kin_mem->kin_m_aa-1)*kin_mem->kin_m_aa+kin_mem->kin_m_aa-1] = sqrt(N_VDotProd(kin_mem->kin_vtemp2, kin_mem->kin_vtemp2));
      N_VScale((1/R[(kin_mem->kin_m_aa-1)*kin_mem->kin_m_aa+kin_mem->kin_m_aa-1]), kin_mem->kin_vtemp2, kin_mem->kin_q_aa[kin_mem->kin_m_aa-1]);

      /* Update the iteration map */
      j = 0;
      for (i=i_pt+1; i < kin_mem->kin_m_aa; i++)
        ipt_map[j++] = i;
      for (i=0; i < (i_pt+1); i++)
        ipt_map[j++] = i;
    }

    /* Solve least squares problem and update solution */
    lAA = iter;
    if (kin_mem->kin_m_aa < iter) lAA = kin_mem->kin_m_aa;

    retval = N_VDotProdMulti(lAA, fv, kin_mem->kin_q_aa, gamma);
    if (retval != KIN_SUCCESS) return(KIN_VECTOROP_ERR);

    /* set arrays for fused vector operation */
    cv[0] = ONE;
    Xv[0] = gval;
    nvec = 1;

    for (i=lAA-1; i > -1; i--) {
      for (j=i+1; j < lAA; j++) {
        gamma[i] = gamma[i]-R[j*kin_mem->kin_m_aa+i]*gamma[j]; 
      }
      gamma[i] = gamma[i]/R[i*kin_mem->kin_m_aa+i];

      cv[nvec] = -gamma[i];
      Xv[nvec] = kin_mem->kin_dg_aa[ipt_map[i]];
      nvec += 1;
    }

    /* update solution */
    retval = N_VLinearCombination(nvec, cv, Xv, x);
    if (retval != KIN_SUCCESS) return(KIN_VECTOROP_ERR);

  }

  return 0;
}